

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Issue.cpp
# Opt level: O2

string * __thiscall
jbcoin::to_string_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Issue *ac)

{
  bool bVar1;
  AccountID *v;
  Currency *currency;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar1 = beast::operator==(this + 0x14);
  if (bVar1) {
    to_string_abi_cxx11_(__return_storage_ptr__,this,(Currency *)v);
  }
  else {
    toBase58_abi_cxx11_(&local_40,this + 0x14,v);
    std::operator+(&local_60,&local_40,"/");
    to_string_abi_cxx11_(&local_80,this,currency);
    std::operator+(__return_storage_ptr__,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
to_string (Issue const& ac)
{
    if (isXRP (ac.account))
        return to_string (ac.currency);

    return to_string(ac.account) + "/" + to_string(ac.currency);
}